

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O0

void __thiscall TextReader::parse_quoted(TextReader *this,char quote_symbol)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  allocator local_39;
  string local_38 [39];
  char local_11;
  TextReader *pTStack_10;
  char quote_symbol_local;
  TextReader *this_local;
  
  this->current_token_len_ = this->current_token_len_ + 1;
  local_11 = quote_symbol;
  pTStack_10 = this;
  while( true ) {
    sVar1 = this->current_token_pos_;
    sVar2 = this->current_token_len_;
    uVar3 = std::__cxx11::string::size();
    bVar5 = false;
    if (sVar1 + sVar2 < uVar3) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_);
      bVar5 = *pcVar4 != local_11;
    }
    if (!bVar5) break;
    this->current_token_len_ = this->current_token_len_ + 1;
  }
  sVar1 = this->current_token_pos_;
  sVar2 = this->current_token_len_;
  uVar3 = std::__cxx11::string::size();
  if ((sVar1 + sVar2 < uVar3) &&
     (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
     *pcVar4 == local_11)) {
    this->current_token_len_ = this->current_token_len_ + 1;
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Missing closing quote symbol",&local_39);
  parse_error(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

inline void parse_quoted(const char quote_symbol) {
        current_token_len_++;
        while (current_token_pos_ + current_token_len_ < current_line_.size() &&
            (current_line_[current_token_pos_ + current_token_len_] != quote_symbol)) {
            current_token_len_++;
        };
        if (current_token_pos_ + current_token_len_ < current_line_.size() &&
            (current_line_[current_token_pos_ + current_token_len_] == quote_symbol)) {
            current_token_len_++;
        } else {
            parse_error(ERROR_MISSING_CLOSING_QUOTE);
        };
    }